

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void duckdb::HistogramFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_40a;
  allocator local_409;
  LogicalType local_408 [24];
  LogicalType local_3f0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3d8;
  string local_3c0;
  AggregateFunction local_3a0;
  AggregateFunction local_270;
  AggregateFunction histogram_function;
  
  duckdb::AggregateFunctionSet::AggregateFunctionSet(in_RDI);
  std::__cxx11::string::string((string *)&local_3c0,"histogram",&local_409);
  duckdb::LogicalType::LogicalType(local_3f0,ANY);
  __l._M_len = 1;
  __l._M_array = local_3f0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3d8,__l,&local_40a);
  duckdb::LogicalType::LogicalType(local_408,MAP);
  AggregateFunction::AggregateFunction
            (&histogram_function,&local_3c0,(vector<duckdb::LogicalType,_true> *)&local_3d8,
             local_408,(aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             HistogramBindFunction<true>,(aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,
             (aggregate_window_t)0x0,(aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  duckdb::LogicalType::~LogicalType(local_408);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3d8);
  duckdb::LogicalType::~LogicalType(local_3f0);
  std::__cxx11::string::~string((string *)&local_3c0);
  BinnedHistogramFunction();
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
             (in_RDI + 0x20),&local_270);
  AggregateFunction::~AggregateFunction(&local_270);
  AggregateFunction::AggregateFunction(&local_3a0,&histogram_function);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
             (in_RDI + 0x20),&local_3a0);
  AggregateFunction::~AggregateFunction(&local_3a0);
  AggregateFunction::~AggregateFunction(&histogram_function);
  return;
}

Assistant:

AggregateFunctionSet HistogramFun::GetFunctions() {
	AggregateFunctionSet fun;
	AggregateFunction histogram_function("histogram", {LogicalType::ANY}, LogicalTypeId::MAP, nullptr, nullptr, nullptr,
	                                     nullptr, nullptr, nullptr, HistogramBindFunction, nullptr);
	fun.AddFunction(HistogramFun::BinnedHistogramFunction());
	fun.AddFunction(histogram_function);
	return fun;
}